

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::BasicInvarianceTest::BasicInvarianceTest
          (BasicInvarianceTest *this,Context *ctx,char *name,char *desc,string *vertexShader1,
          string *vertexShader2)

{
  allocator<char> local_21;
  
  gles3::TestCase::TestCase((TestCase *)this,ctx,name,desc);
  (this->super_InvarianceTest).m_shader0 = (ShaderProgram *)0x0;
  (this->super_InvarianceTest).m_shader1 = (ShaderProgram *)0x0;
  (this->super_InvarianceTest).m_arrayBuf = 0;
  (this->super_InvarianceTest).m_verticesInPattern = 0;
  (this->super_InvarianceTest).m_renderSize = 0x100;
  (this->super_InvarianceTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BasicInvarianceTest_01e42468;
  std::__cxx11::string::string((string *)&this->m_vertexShader1,(string *)vertexShader1);
  std::__cxx11::string::string((string *)&this->m_vertexShader2,(string *)vertexShader2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_fragmentShader,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nuniform mediump vec4 u_color;\nin mediump vec4 v_unrelated;\nvoid main ()\n{\n\tmediump float blue = dot(v_unrelated, vec4(1.0, 1.0, 1.0, 1.0));\n\tfragColor = vec4(u_color.r, u_color.g, blue, u_color.a);\n}\n"
             ,&local_21);
  return;
}

Assistant:

BasicInvarianceTest::BasicInvarianceTest (Context& ctx, const char* name, const char* desc, const std::string& vertexShader1, const std::string& vertexShader2)
	: InvarianceTest	(ctx, name, desc)
	, m_vertexShader1	(vertexShader1)
	, m_vertexShader2	(vertexShader2)
	, m_fragmentShader	(s_basicFragmentShader)
{
}